

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

void P_PlayerThink(player_t *player)

{
  ticcmd_t *ptVar1;
  byte *pbVar2;
  float fVar3;
  double dVar4;
  char cVar5;
  short sVar6;
  uint uVar7;
  sector_t *psVar8;
  float fVar9;
  undefined1 *puVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  Node *pNVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AInventory *pAVar19;
  short sVar20;
  int iVar21;
  short sVar22;
  uint uVar23;
  int iVar24;
  Node *pNVar25;
  AActor *pAVar26;
  char *musicname;
  APlayerPawn *pAVar27;
  ulong uVar28;
  ulong uVar29;
  float fVar30;
  double dVar31;
  double dVar32;
  float fVar33;
  FName local_50;
  FName local_4c;
  FSoundID local_48;
  FSoundID local_44;
  FName local_40;
  FSoundID local_3c;
  DAngle local_38;
  DAngle local_30;
  PClass *pPVar18;
  
  if (player->mo == (APlayerPawn *)0x0) {
    I_Error("No player %td start\n");
  }
  if ((debugfile != (FILE *)0x0) && ((player->cheats & 0x2000) == 0)) {
    pAVar27 = player->mo;
    fprintf((FILE *)debugfile,"tic %d for pl %d: (%f, %f, %f, %f) b:%02x p:%d y:%d f:%d s:%d u:%d\n"
            ,(pAVar27->super_AActor).__Pos.X,(pAVar27->super_AActor).__Pos.Y,
            (pAVar27->super_AActor).__Pos.Z,(pAVar27->super_AActor).Angles.Yaw.Degrees,
            (ulong)(uint)gametic,
            (ulong)(uint)((int)((ulong)&player[-0x9192].secretcount >> 5) * 0x3cf3cf3d),
            (ulong)(player->cmd).ucmd.buttons,(ulong)(uint)(int)(player->cmd).ucmd.pitch,
            (ulong)(uint)(int)(player->cmd).ucmd.yaw,
            (ulong)(uint)(int)(player->cmd).ucmd.forwardmove,
            (ulong)(uint)(int)(player->cmd).ucmd.sidemove,
            (ulong)(uint)(int)(player->cmd).ucmd.upmove);
  }
  fVar30 = player->DesiredFOV;
  if ((player->playerstate != '\x01') && (player->ReadyWeapon != (AWeapon *)0x0)) {
    fVar3 = player->ReadyWeapon->FOVScale;
    if ((fVar3 != 0.0) || (NAN(fVar3))) {
      fVar30 = fVar30 * ABS(fVar3);
    }
  }
  fVar3 = player->FOV;
  if ((fVar3 != fVar30) || (NAN(fVar3) || NAN(fVar30))) {
    if (7.0 <= ABS(fVar3 - fVar30)) {
      fVar33 = ABS(fVar3 - fVar30) * 0.025;
      fVar9 = 7.0;
      if (7.0 <= fVar33) {
        fVar9 = fVar33;
      }
      fVar30 = (float)(-(uint)(fVar30 < fVar3) & (uint)-fVar9 |
                      ~-(uint)(fVar30 < fVar3) & (uint)fVar9) + fVar3;
    }
    player->FOV = fVar30;
  }
  if (player->inventorytics != 0) {
    player->inventorytics = player->inventorytics + -1;
  }
  uVar23 = 0xffffbfff;
  if ((player->cheats & 0x40000001U) == 0x40000000) {
    uVar23 = 0xbfffbffe;
  }
  uVar23 = uVar23 & player->cheats;
  player->cheats = uVar23;
  pAVar27 = player->mo;
  if ((uVar23 & 0x40000001) == 0) {
    pPVar18 = (pAVar27->super_AActor).super_DThinker.super_DObject.Class;
    if (pPVar18 == (PClass *)0x0) {
      iVar17 = (**(pAVar27->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar27);
      pPVar18 = (PClass *)CONCAT44(extraout_var,iVar17);
      (pAVar27->super_AActor).super_DThinker.super_DObject.Class = pPVar18;
      pAVar27 = player->mo;
    }
    if ((pPVar18->Defaults[0x1bd] & 0x10) != 0) goto LAB_00469de4;
    uVar23 = (pAVar27->super_AActor).flags.Value & 0xffffefff;
  }
  else {
LAB_00469de4:
    uVar23 = (pAVar27->super_AActor).flags.Value | 0x1000;
  }
  (pAVar27->super_AActor).flags.Value = uVar23;
  if ((player->cheats & 0x40000000) == 0) {
    if (((pAVar27->super_AActor).flags2.Value & 0x10) == 0) {
      pPVar18 = (pAVar27->super_AActor).super_DThinker.super_DObject.Class;
      if (pPVar18 == (PClass *)0x0) {
        iVar17 = (**(pAVar27->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar27);
        pPVar18 = (PClass *)CONCAT44(extraout_var_00,iVar17);
        (pAVar27->super_AActor).super_DThinker.super_DObject.Class = pPVar18;
        pAVar27 = player->mo;
      }
      if ((pPVar18->Defaults[0x1bd] & 2) == 0) {
        pbVar2 = (byte *)((long)&(pAVar27->super_AActor).flags.Value + 1);
        *pbVar2 = *pbVar2 & 0xfd;
      }
    }
  }
  else {
    (pAVar27->super_AActor).flags.Value = uVar23 | 0x200;
  }
  player->original_oldbuttons = (player->original_cmd).buttons;
  sVar6 = (player->cmd).ucmd.pitch;
  sVar20 = (player->cmd).ucmd.yaw;
  sVar22 = (player->cmd).ucmd.roll;
  sVar11 = (player->cmd).ucmd.forwardmove;
  sVar12 = (player->cmd).ucmd.sidemove;
  sVar13 = (player->cmd).ucmd.upmove;
  (player->original_cmd).buttons = (player->cmd).ucmd.buttons;
  (player->original_cmd).pitch = sVar6;
  (player->original_cmd).yaw = sVar20;
  (player->original_cmd).roll = sVar22;
  (player->original_cmd).forwardmove = sVar11;
  (player->original_cmd).sidemove = sVar12;
  (player->original_cmd).upmove = sVar13;
  uVar23 = (pAVar27->super_AActor).flags.Value;
  if ((char)uVar23 < '\0') {
    (player->cmd).ucmd.yaw = 0;
    (player->cmd).ucmd.forwardmove = 0x6400;
    (player->cmd).ucmd.sidemove = 0;
    (pAVar27->super_AActor).flags.Value = uVar23 & 0xffffff7f;
  }
  ptVar1 = &player->cmd;
  uVar23 = 0;
  if (gamestate == GS_TITLELEVEL) {
LAB_00469ecb:
    (player->cmd).ucmd.buttons = uVar23;
    player->turnticks = '\0';
    (player->cmd).ucmd.pitch = 0;
    (player->cmd).ucmd.yaw = 0;
    (player->cmd).ucmd.roll = 0;
    (player->cmd).ucmd.forwardmove = 0;
    (player->cmd).ucmd.sidemove = 0;
    (player->cmd).ucmd.upmove = 0;
    bVar16 = true;
  }
  else {
    if ((((uint)player->cheats >> 0xc & 1) != 0) ||
       ((((byte)level.flags2 & 0x20) != 0 && (player->timefreezer == 0)))) {
      uVar23 = (ptVar1->ucmd).buttons & 2;
      goto LAB_00469ecb;
    }
    if ((player->cheats & 0x40U) != 0) {
      (player->cmd).ucmd.forwardmove = 0;
      (player->cmd).ucmd.sidemove = 0;
      (player->cmd).ucmd.upmove = 0;
    }
    bVar16 = false;
  }
  uVar23 = (ptVar1->ucmd).buttons;
  if ((uVar23 & 4) != 0) {
    (ptVar1->ucmd).buttons = uVar23 & 0xfffffff7;
  }
  if ((((player->morphTics == 0) || ((pAVar27->PlayerFlags & 4) != 0)) && (0 < player->health)) &&
     (bVar15 = FLevelLocals::IsCrouchingAllowed(&level), bVar15)) {
    if (!bVar16) {
      cVar5 = player->crouching;
      uVar23 = (player->cmd).ucmd.buttons;
      if (cVar5 == '\0') {
        if ((uVar23 & 8) != 0) goto LAB_0046a0fd;
LAB_0046a0bb:
        if ((1.0 < player->crouchfactor || player->crouchfactor == 1.0) ||
           (pAVar27 = player->mo,
           (pAVar27->super_AActor).ceilingz <=
           (pAVar27->super_AActor).__Pos.Z + (pAVar27->super_AActor).Height)) goto LAB_00469fa3;
        iVar17 = 1;
LAB_0046a11b:
        P_CrouchMove(player,iVar17);
      }
      else {
        if ((uVar23 & 8) != 0) {
          player->crouching = '\0';
        }
        if (cVar5 == -1) {
LAB_0046a0fd:
          if (0.5 < player->crouchfactor) {
            iVar17 = -1;
            goto LAB_0046a11b;
          }
        }
        else if (cVar5 == '\x01') goto LAB_0046a0bb;
      }
    }
  }
  else if ((player->crouchfactor != 1.0) || (NAN(player->crouchfactor))) {
    player->crouchfactor = 1.0;
    player->crouching = '\0';
    player->crouchdir = '\0';
    player->crouchoffset = 0.0;
    player->crouchviewdelta = 0.0;
    player->viewheight = player->mo->ViewHeight;
  }
LAB_00469fa3:
  player->crouchoffset = (1.0 - player->crouchfactor) * -player->mo->ViewHeight;
  cVar5 = player->MUSINFOtics;
  if ((-1 < cVar5) && (pAVar26 = (player->MUSINFOactor).field_0.p, pAVar26 != (AActor *)0x0)) {
    if (((pAVar26->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      player->MUSINFOtics = cVar5 + -1;
      if (cVar5 == '\0') {
        uVar28 = ((long)&player[-0x9192].secretcount >> 5) * -0x30c30c30c30c30c3;
        if (uVar28 - (long)consoleplayer == 0) {
          uVar23 = pAVar26->args[0];
          if (uVar23 == 0) {
            musicname = "*";
            iVar17 = 0;
          }
          else {
            pNVar14 = ((level.info)->MusicMap).Nodes + (((level.info)->MusicMap).Size - 1 & uVar23);
            do {
              pNVar25 = pNVar14;
              if ((pNVar25 == (Node *)0x0) || (pNVar25->Next == (Node *)0x1)) goto LAB_0046a13a;
              pNVar14 = pNVar25->Next;
            } while ((pNVar25->Pair).Key != uVar23);
            musicname = FName::NameData.NameArray[(pNVar25->Pair).Value.Index].Text;
            iVar17 = pAVar26->args[1];
          }
          S_ChangeMusic(musicname,iVar17,true,false);
        }
LAB_0046a13a:
        DPrintf(3,"MUSINFO change for player %d to %d\n",uVar28 & 0xffffffff,
                (ulong)(uint)((player->MUSINFOactor).field_0.p)->args[0]);
      }
    }
    else {
      (player->MUSINFOactor).field_0.p = (AActor *)0x0;
    }
  }
  if (player->playerstate == '\x01') {
    if ((player->crouchfactor != 1.0) || (NAN(player->crouchfactor))) {
      player->crouchfactor = 1.0;
      player->crouching = '\0';
      player->crouchdir = '\0';
      player->crouchoffset = 0.0;
      player->crouchviewdelta = 0.0;
      player->viewheight = player->mo->ViewHeight;
    }
    P_DeathThink(player);
    return;
  }
  iVar17 = player->jumpTics;
  if (iVar17 != 0) {
    iVar24 = 0;
    if (player->onground == false) {
      iVar24 = iVar17 + -1;
    }
    if (-0x12 < iVar17) {
      iVar24 = iVar17 + -1;
    }
    player->jumpTics = iVar24;
  }
  if ((player->morphTics != 0) && ((player->cheats & 0x2000) == 0)) {
    APlayerPawn::MorphPlayerThink(player->mo);
  }
  bVar16 = FLevelLocals::IsFreelookAllowed(&level);
  if (bVar16) {
    sVar6 = (player->cmd).ucmd.pitch;
    if (sVar6 != 0) {
      if (sVar6 == -0x8000) {
        player->centering = true;
      }
      else if (player->centering == false) {
        dVar31 = (double)(int)sVar6 * -0.0054931640625 +
                 (player->mo->super_AActor).Angles.Pitch.Degrees;
        dVar32 = (player->MinPitch).Degrees;
        dVar4 = (player->MaxPitch).Degrees;
        uVar28 = -(ulong)(dVar4 <= dVar31);
        uVar29 = -(ulong)(dVar32 < dVar31);
        (player->mo->super_AActor).Angles.Pitch.Degrees =
             (double)(~uVar29 & (ulong)dVar32 |
                     (uVar28 & (ulong)dVar4 | ~uVar28 & (ulong)dVar31) & uVar29);
      }
    }
  }
  else {
    (player->mo->super_AActor).Angles.Pitch.Degrees = 0.0;
  }
  if (player->centering == true) {
    pAVar27 = player->mo;
    dVar32 = (pAVar27->super_AActor).Angles.Pitch.Degrees;
    if (ABS(dVar32) <= 2.0) {
      (pAVar27->super_AActor).Angles.Pitch.Degrees = 0.0;
      player->centering = false;
      if (((long)&player[-0x9192].secretcount >> 5) * -0x30c30c30c30c30c3 - (long)consoleplayer == 0
         ) {
        LocalViewPitch = 0;
      }
    }
    else {
      (pAVar27->super_AActor).Angles.Pitch.Degrees = dVar32 * 0.6666666666666666;
    }
  }
  if ((((ptVar1->ucmd).buttons & 0x10) != 0) && ((player->oldbuttons & 0x10) == 0)) {
    player->turnticks = '\t';
  }
  iVar17 = (player->mo->super_AActor).reactiontime;
  if (iVar17 == 0) {
    P_MovePlayer(player);
    if (((player->cmd).ucmd.buttons & 4) != 0) {
      dVar32 = player->crouchoffset;
      if ((dVar32 != 0.0) || (NAN(dVar32))) {
        player->crouching = '\x01';
      }
      else {
        pAVar27 = player->mo;
        if ((pAVar27->super_AActor).waterlevel < 2) {
          if (((pAVar27->super_AActor).flags.Value & 0x200) == 0) {
            bVar16 = FLevelLocals::IsJumpingAllowed(&level);
            if (((bVar16) && (player->onground == true)) && (player->jumpTics == 0)) {
              pAVar27 = player->mo;
              dVar32 = (pAVar27->JumpZ * 35.0) / 35.0;
              uVar23 = player->cheats;
              if ((uVar23 >> 0x12 & 1) != 0) {
                dVar32 = dVar32 + dVar32;
              }
              (pAVar27->super_AActor).Vel.Z = dVar32 + (pAVar27->super_AActor).Vel.Z;
              puVar10 = (undefined1 *)((long)&(pAVar27->super_AActor).flags2.Value + 1);
              *puVar10 = *puVar10 & 0xf7;
              player->jumpTics = -1;
              if ((uVar23 >> 0xd & 1) == 0) {
                local_3c.ID = S_FindSound("*jump");
                S_Sound(&pAVar27->super_AActor,4,&local_3c,1.0,1.0);
              }
            }
          }
          else {
            (pAVar27->super_AActor).Vel.Z = 3.0;
          }
        }
        else {
          (pAVar27->super_AActor).Vel.Z = (pAVar27->super_AActor).Speed * 4.0;
        }
      }
    }
    sVar6 = (player->cmd).ucmd.upmove;
    if (sVar6 != 0) {
      if (sVar6 == -0x8000) {
        pAVar27 = player->mo;
        uVar23 = (pAVar27->super_AActor).flags.Value;
        if (((uVar23 >> 9 & 1) != 0) && ((pAVar27->super_AActor).waterlevel < 2)) {
          (pAVar27->super_AActor).flags.Value = uVar23 & 0xfffffdff;
        }
      }
      else {
        sVar20 = sVar6;
        if (0x2ff < sVar6) {
          sVar20 = 0x300;
        }
        sVar22 = -0x300;
        if (-0x300 < sVar20) {
          sVar22 = sVar20;
        }
        (player->cmd).ucmd.upmove = sVar22;
        pAVar27 = player->mo;
        if ((pAVar27->super_AActor).waterlevel < 2) {
          uVar23 = (pAVar27->super_AActor).flags2.Value;
          if (((uVar23 & 0x10) == 0) && (((uint)player->cheats >> 0x1e & 1) == 0)) {
            if (((uint)player->cheats >> 0xd & 1) == 0 && 0 < sVar6) {
              local_40.Index = 0x61;
              pAVar19 = AActor::FindInventory(&pAVar27->super_AActor,&local_40);
              if (pAVar19 != (AInventory *)0x0) {
                (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x17])();
              }
            }
          }
          else {
            dVar32 = (double)(int)sVar22 * (pAVar27->super_AActor).Speed * 0.0078125;
            (pAVar27->super_AActor).Vel.Z = dVar32;
            uVar7 = (pAVar27->super_AActor).flags.Value;
            if ((uVar7 >> 9 & 1) == 0) {
              (pAVar27->super_AActor).flags2.Value = uVar23 | 0x10;
              (pAVar27->super_AActor).flags.Value = uVar7 | 0x200;
              if ((dVar32 <= -39.0) && ((player->cheats & 0x2000) == 0)) {
                S_StopSound(&pAVar27->super_AActor,2);
              }
            }
          }
        }
        else {
          (pAVar27->super_AActor).Vel.Z =
               (double)(int)sVar22 * (pAVar27->super_AActor).Speed * 0.0078125;
        }
      }
    }
  }
  else {
    (player->mo->super_AActor).reactiontime = iVar17 + -1;
  }
  P_CalcHeight(player);
  if ((player->cheats & 0x2000) != 0) {
    return;
  }
  P_PlayerOnSpecial3DFloor(player);
  P_PlayerInSpecialSector(player,(sector_t *)0x0);
  pAVar27 = player->mo;
  psVar8 = (pAVar27->super_AActor).Sector;
  if (((pAVar27->super_AActor).__Pos.Z <=
       ((pAVar27->super_AActor).__Pos.Y * (psVar8->floorplane).normal.Y +
       (psVar8->floorplane).D + (pAVar27->super_AActor).__Pos.X * (psVar8->floorplane).normal.X) *
       (psVar8->floorplane).negiC + 1.52587890625e-05) || ((pAVar27->super_AActor).waterlevel != 0))
  {
    iVar17 = P_GetThingFloorType(&pAVar27->super_AActor);
    P_PlayerOnSpecialFlat(player,iVar17);
    pAVar27 = player->mo;
  }
  dVar32 = (pAVar27->super_AActor).Vel.Z;
  if ((((dVar32 <= -pAVar27->FallingScreamMinSpeed) && (-pAVar27->FallingScreamMaxSpeed <= dVar32))
      && (player->morphTics == 0)) && ((pAVar27->super_AActor).waterlevel == 0)) {
    local_44.ID = S_FindSound("*falling");
    iVar17 = S_FindSkinnedSound(&pAVar27->super_AActor,&local_44);
    if ((iVar17 != 0) &&
       (bVar16 = S_IsActorPlayingSomething(&player->mo->super_AActor,2,iVar17), !bVar16)) {
      local_48.ID = iVar17;
      S_Sound(&player->mo->super_AActor,2,&local_48,1.0,1.0);
    }
  }
  if (((player->cmd).ucmd.buttons & 2) == 0) {
    player->usedown = false;
  }
  else if (player->usedown == false) {
    player->usedown = true;
    bVar16 = P_TalkFacing(&player->mo->super_AActor);
    if (!bVar16) {
      P_UseLines(player);
    }
  }
  if (player->morphTics != 0) {
    if (player->chickenPeck != 0) {
      player->chickenPeck = player->chickenPeck + -3;
    }
    iVar17 = player->morphTics + -1;
    player->morphTics = iVar17;
    if (iVar17 == 0) {
      P_UndoPlayerMorph(player,player,0x1000,false);
    }
  }
  player_t::TickPSprites(player);
  if (player->damagecount != 0) {
    player->damagecount = player->damagecount + -1;
  }
  if (player->bonuscount != 0) {
    player->bonuscount = player->bonuscount + -1;
  }
  iVar17 = player->hazardcount;
  if (iVar17 != 0) {
    player->hazardcount = iVar17 + -1;
    if ((0x231 < iVar17) && (level.time % player->hazardinterval == 0)) {
      local_4c.Index = (player->hazardtype).Index;
      local_30.Degrees = 0.0;
      P_DamageMobj(&player->mo->super_AActor,(AActor *)0x0,(AActor *)0x0,5,&local_4c,0,&local_30);
    }
  }
  iVar17 = player->poisoncount;
  if ((iVar17 == 0) || ((level.time & 0xfU) != 0)) goto LAB_0046a557;
  iVar24 = iVar17 + -5;
  if (iVar17 < 5) {
    iVar24 = 0;
  }
  player->poisoncount = iVar24;
  pAVar26 = (player->poisoner).field_0.p;
  if (pAVar26 == (AActor *)0x0) {
LAB_0046a543:
    pAVar26 = (AActor *)0x0;
  }
  else if (((pAVar26->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (player->poisoner).field_0.p = (AActor *)0x0;
    goto LAB_0046a543;
  }
  P_PoisonDamage(player,pAVar26,1,true);
LAB_0046a557:
  pAVar27 = player->mo;
  if (((byte)dmflags2.Value & 0x80) != 0) {
    iVar17 = pAVar27->MaxHealth;
    if ((pAVar27->MaxHealth < 1) && (iVar17 = 100, (i_compatflags._1_1_ & 0x10) == 0)) {
      iVar17 = deh.MaxHealth;
    }
    if (level.time * -0x75075075 + 0x3a83a83U < 0x7507507) {
      iVar17 = iVar17 + (pAVar27->super_AActor).stamina;
      iVar24 = player->health;
      if (iVar17 < iVar24) {
        iVar21 = iVar24 + -1;
        if (iVar24 + -5 < iVar17) {
          iVar21 = iVar17;
        }
        player->health = iVar21;
        (pAVar27->super_AActor).health = iVar21;
      }
    }
  }
  if ((((pAVar27->super_AActor).waterlevel < 3) ||
      (((pAVar27->super_AActor).flags2.Value & 0x8000000) != 0)) ||
     ((player->cheats & 0x42000002U) != 0)) {
    APlayerPawn::ResetAirSupply(pAVar27,true);
  }
  else if ((level.time & 0x1fU) == 0 && player->air_finished <= level.time) {
    local_50.Index = 0xbf;
    local_38.Degrees = 0.0;
    P_DamageMobj(&pAVar27->super_AActor,(AActor *)0x0,(AActor *)0x0,
                 (level.time - player->air_finished) / 0x23 + 2,&local_50,0,&local_38);
  }
  return;
}

Assistant:

void P_PlayerThink (player_t *player)
{
	ticcmd_t *cmd;

	if (player->mo == NULL)
	{
		I_Error ("No player %td start\n", player - players + 1);
	}

	if (debugfile && !(player->cheats & CF_PREDICTING))
	{
		fprintf (debugfile, "tic %d for pl %d: (%f, %f, %f, %f) b:%02x p:%d y:%d f:%d s:%d u:%d\n",
			gametic, (int)(player-players), player->mo->X(), player->mo->Y(), player->mo->Z(),
			player->mo->Angles.Yaw.Degrees, player->cmd.ucmd.buttons,
			player->cmd.ucmd.pitch, player->cmd.ucmd.yaw, player->cmd.ucmd.forwardmove,
			player->cmd.ucmd.sidemove, player->cmd.ucmd.upmove);
	}

	// [RH] Zoom the player's FOV
	float desired = player->DesiredFOV;
	// Adjust FOV using on the currently held weapon.
	if (player->playerstate != PST_DEAD &&		// No adjustment while dead.
		player->ReadyWeapon != NULL &&			// No adjustment if no weapon.
		player->ReadyWeapon->FOVScale != 0)		// No adjustment if the adjustment is zero.
	{
		// A negative scale is used to prevent G_AddViewAngle/G_AddViewPitch
		// from scaling with the FOV scale.
		desired *= fabsf(player->ReadyWeapon->FOVScale);
	}
	if (player->FOV != desired)
	{
		if (fabsf (player->FOV - desired) < 7.f)
		{
			player->FOV = desired;
		}
		else
		{
			float zoom = MAX(7.f, fabsf(player->FOV - desired) * 0.025f);
			if (player->FOV > desired)
			{
				player->FOV = player->FOV - zoom;
			}
			else
			{
				player->FOV = player->FOV + zoom;
			}
		}
	}
	if (player->inventorytics)
	{
		player->inventorytics--;
	}
	// Don't interpolate the view for more than one tic
	player->cheats &= ~CF_INTERPVIEW;

	// No-clip cheat
	if ((player->cheats & (CF_NOCLIP | CF_NOCLIP2)) == CF_NOCLIP2)
	{ // No noclip2 without noclip
		player->cheats &= ~CF_NOCLIP2;
	}
	if (player->cheats & (CF_NOCLIP | CF_NOCLIP2) || (player->mo->GetDefault()->flags & MF_NOCLIP))
	{
		player->mo->flags |= MF_NOCLIP;
	}
	else
	{
		player->mo->flags &= ~MF_NOCLIP;
	}
	if (player->cheats & CF_NOCLIP2)
	{
		player->mo->flags |= MF_NOGRAVITY;
	}
	else if (!(player->mo->flags2 & MF2_FLY) && !(player->mo->GetDefault()->flags & MF_NOGRAVITY))
	{
		player->mo->flags &= ~MF_NOGRAVITY;
	}
	cmd = &player->cmd;

	// Make unmodified copies for ACS's GetPlayerInput.
	player->original_oldbuttons = player->original_cmd.buttons;
	player->original_cmd = cmd->ucmd;

	if (player->mo->flags & MF_JUSTATTACKED)
	{ // Chainsaw/Gauntlets attack auto forward motion
		cmd->ucmd.yaw = 0;
		cmd->ucmd.forwardmove = 0xc800/2;
		cmd->ucmd.sidemove = 0;
		player->mo->flags &= ~MF_JUSTATTACKED;
	}

	bool totallyfrozen = P_IsPlayerTotallyFrozen(player);

	// [RH] Being totally frozen zeros out most input parameters.
	if (totallyfrozen)
	{
		if (gamestate == GS_TITLELEVEL)
		{
			cmd->ucmd.buttons = 0;
		}
		else
		{
			cmd->ucmd.buttons &= BT_USE;
		}
		cmd->ucmd.pitch = 0;
		cmd->ucmd.yaw = 0;
		cmd->ucmd.roll = 0;
		cmd->ucmd.forwardmove = 0;
		cmd->ucmd.sidemove = 0;
		cmd->ucmd.upmove = 0;
		player->turnticks = 0;
	}
	else if (player->cheats & CF_FROZEN)
	{
		cmd->ucmd.forwardmove = 0;
		cmd->ucmd.sidemove = 0;
		cmd->ucmd.upmove = 0;
	}

	// Handle crouching
	if (player->cmd.ucmd.buttons & BT_JUMP)
	{
		player->cmd.ucmd.buttons &= ~BT_CROUCH;
	}
	if (player->CanCrouch() && player->health > 0 && level.IsCrouchingAllowed())
	{
		if (!totallyfrozen)
		{
			int crouchdir = player->crouching;
		
			if (crouchdir == 0)
			{
				crouchdir = (player->cmd.ucmd.buttons & BT_CROUCH) ? -1 : 1;
			}
			else if (player->cmd.ucmd.buttons & BT_CROUCH)
			{
				player->crouching = 0;
			}
			if (crouchdir == 1 && player->crouchfactor < 1 &&
				player->mo->Top() < player->mo->ceilingz)
			{
				P_CrouchMove(player, 1);
			}
			else if (crouchdir == -1 && player->crouchfactor > 0.5)
			{
				P_CrouchMove(player, -1);
			}
		}
	}
	else
	{
		player->Uncrouch();
	}

	player->crouchoffset = -(player->mo->ViewHeight) * (1 - player->crouchfactor);

	// MUSINFO stuff
	if (player->MUSINFOtics >= 0 && player->MUSINFOactor != NULL)
	{
		if (--player->MUSINFOtics < 0)
		{
			if (player - players == consoleplayer)
			{
				if (player->MUSINFOactor->args[0] != 0)
				{
					FName *music = level.info->MusicMap.CheckKey(player->MUSINFOactor->args[0]);

					if (music != NULL)
					{
						S_ChangeMusic(music->GetChars(), player->MUSINFOactor->args[1]);
					}
				}
				else
				{
					S_ChangeMusic("*");
				}
			}
			DPrintf(DMSG_NOTIFY, "MUSINFO change for player %d to %d\n", (int)(player - players), player->MUSINFOactor->args[0]);
		}
	}

	if (player->playerstate == PST_DEAD)
	{
		player->Uncrouch();
		P_DeathThink (player);
		return;
	}
	if (player->jumpTics != 0)
	{
		player->jumpTics--;
		if (player->onground && player->jumpTics < -18)
		{
			player->jumpTics = 0;
		}
	}
	if (player->morphTics && !(player->cheats & CF_PREDICTING))
	{
		player->mo->MorphPlayerThink ();
	}

	// [RH] Look up/down stuff
	if (!level.IsFreelookAllowed())
	{
		player->mo->Angles.Pitch = 0.;
	}
	else
	{
		// The player's view pitch is clamped between -32 and +56 degrees,
		// which translates to about half a screen height up and (more than)
		// one full screen height down from straight ahead when view panning
		// is used.
		int clook = cmd->ucmd.pitch;
		if (clook != 0)
		{
			if (clook == -32768)
			{ // center view
				player->centering = true;
			}
			else if (!player->centering)
			{
				// no more overflows with floating point. Yay! :)
				player->mo->Angles.Pitch = clamp(player->mo->Angles.Pitch - clook * (360. / 65536.), player->MinPitch, player->MaxPitch);
			}
		}
	}
	if (player->centering)
	{
		if (fabs(player->mo->Angles.Pitch) > 2.)
		{
			player->mo->Angles.Pitch *= (2. / 3.);
		}
		else
		{
			player->mo->Angles.Pitch = 0.;
			player->centering = false;
			if (player - players == consoleplayer)
			{
				LocalViewPitch = 0;
			}
		}
	}

	// [RH] Check for fast turn around
	if (cmd->ucmd.buttons & BT_TURN180 && !(player->oldbuttons & BT_TURN180))
	{
		player->turnticks = TURN180_TICKS;
	}

	// Handle movement
	if (player->mo->reactiontime)
	{ // Player is frozen
		player->mo->reactiontime--;
	}
	else
	{
		P_MovePlayer (player);

		// [RH] check for jump
		if (cmd->ucmd.buttons & BT_JUMP)
		{
			if (player->crouchoffset != 0)
			{
				// Jumping while crouching will force an un-crouch but not jump
				player->crouching = 1;
			}
			else if (player->mo->waterlevel >= 2)
			{
				player->mo->Vel.Z = 4 * player->mo->Speed;
			}
			else if (player->mo->flags & MF_NOGRAVITY)
			{
				player->mo->Vel.Z = 3.;
			}
			else if (level.IsJumpingAllowed() && player->onground && player->jumpTics == 0)
			{
				double jumpvelz = player->mo->JumpZ * 35 / TICRATE;

				// [BC] If the player has the high jump power, double his jump velocity.
				if ( player->cheats & CF_HIGHJUMP )	jumpvelz *= 2;

				player->mo->Vel.Z += jumpvelz;
				player->mo->flags2 &= ~MF2_ONMOBJ;
				player->jumpTics = -1;
				if (!(player->cheats & CF_PREDICTING))
					S_Sound(player->mo, CHAN_BODY, "*jump", 1, ATTN_NORM);
			}
		}

		if (cmd->ucmd.upmove == -32768)
		{ // Only land if in the air
			if ((player->mo->flags & MF_NOGRAVITY) && player->mo->waterlevel < 2)
			{
				//player->mo->flags2 &= ~MF2_FLY;
				player->mo->flags &= ~MF_NOGRAVITY;
			}
		}
		else if (cmd->ucmd.upmove != 0)
		{
			// Clamp the speed to some reasonable maximum.
			cmd->ucmd.upmove = clamp<short>(cmd->ucmd.upmove, -0x300, 0x300);
			if (player->mo->waterlevel >= 2 || (player->mo->flags2 & MF2_FLY) || (player->cheats & CF_NOCLIP2))
			{
				player->mo->Vel.Z = player->mo->Speed * cmd->ucmd.upmove / 128.;
				if (player->mo->waterlevel < 2 && !(player->mo->flags & MF_NOGRAVITY))
				{
					player->mo->flags2 |= MF2_FLY;
					player->mo->flags |= MF_NOGRAVITY;
					if ((player->mo->Vel.Z <= -39) && !(player->cheats & CF_PREDICTING))
					{ // Stop falling scream
						S_StopSound (player->mo, CHAN_VOICE);
					}
				}
			}
			else if (cmd->ucmd.upmove > 0 && !(player->cheats & CF_PREDICTING))
			{
				AInventory *fly = player->mo->FindInventory (NAME_ArtiFly);
				if (fly != NULL)
				{
					player->mo->UseInventory (fly);
				}
			}
		}
	}

	P_CalcHeight (player);

	if (!(player->cheats & CF_PREDICTING))
	{
		P_PlayerOnSpecial3DFloor (player);
		P_PlayerInSpecialSector (player);

		if (!player->mo->isAbove(player->mo->Sector->floorplane.ZatPoint(player->mo)) ||
			player->mo->waterlevel)
		{
			// Player must be touching the floor
			P_PlayerOnSpecialFlat(player, P_GetThingFloorType(player->mo));
		}
		if (player->mo->Vel.Z <= -player->mo->FallingScreamMinSpeed &&
			player->mo->Vel.Z >= -player->mo->FallingScreamMaxSpeed && !player->morphTics &&
			player->mo->waterlevel == 0)
		{
			int id = S_FindSkinnedSound (player->mo, "*falling");
			if (id != 0 && !S_IsActorPlayingSomething (player->mo, CHAN_VOICE, id))
			{
				S_Sound (player->mo, CHAN_VOICE, id, 1, ATTN_NORM);
			}
		}
		// check for use
		if (cmd->ucmd.buttons & BT_USE)
		{
			if (!player->usedown)
			{
				player->usedown = true;
				if (!P_TalkFacing(player->mo))
				{
					P_UseLines(player);
				}
			}
		}
		else
		{
			player->usedown = false;
		}
		// Morph counter
		if (player->morphTics)
		{
			if (player->chickenPeck)
			{ // Chicken attack counter
				player->chickenPeck -= 3;
			}
			if (!--player->morphTics)
			{ // Attempt to undo the chicken/pig
				P_UndoPlayerMorph (player, player, MORPH_UNDOBYTIMEOUT);
			}
		}
		// Cycle psprites
		player->TickPSprites();

		// Other Counters
		if (player->damagecount)
			player->damagecount--;

		if (player->bonuscount)
			player->bonuscount--;

		if (player->hazardcount)
		{
			player->hazardcount--;
			if (!(level.time % player->hazardinterval) && player->hazardcount > 16*TICRATE)
				P_DamageMobj (player->mo, NULL, NULL, 5, player->hazardtype);
		}

		if (player->poisoncount && !(level.time & 15))
		{
			player->poisoncount -= 5;
			if (player->poisoncount < 0)
			{
				player->poisoncount = 0;
			}
			P_PoisonDamage (player, player->poisoner, 1, true);
		}

		// Apply degeneration.
		if (dmflags2 & DF2_YES_DEGENERATION)
		{
			int maxhealth = player->mo->GetMaxHealth() + player->mo->stamina;
			if ((level.time % TICRATE) == 0 && player->health > maxhealth)
			{
				if (player->health - 5 < maxhealth)
					player->health = maxhealth;
				else
					player->health--;

				player->mo->health = player->health;
			}
		}

		// Handle air supply
		//if (level.airsupply > 0)
		{
			if (player->mo->waterlevel < 3 ||
				(player->mo->flags2 & MF2_INVULNERABLE) ||
				(player->cheats & (CF_GODMODE | CF_NOCLIP2)) ||
				(player->cheats & CF_GODMODE2))
			{
				player->mo->ResetAirSupply ();
			}
			else if (player->air_finished <= level.time && !(level.time & 31))
			{
				P_DamageMobj (player->mo, NULL, NULL, 2 + ((level.time-player->air_finished)/TICRATE), NAME_Drowning);
			}
		}
	}
}